

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationKeyByteSink::Resize
          (CollationKeyByteSink *this,int32_t appendCapacity,int32_t length)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  int32_t iVar4;
  int32_t newCapacity;
  bool bVar5;
  
  bVar5 = false;
  if ((this->super_SortKeyByteSink).buffer_ != (char *)0x0) {
    iVar1 = (this->super_SortKeyByteSink).capacity_ * 2;
    iVar3 = length + appendCapacity * 2;
    if (iVar1 <= iVar3) {
      iVar1 = iVar3;
    }
    newCapacity = 200;
    if (200 < iVar1) {
      newCapacity = iVar1;
    }
    puVar2 = CollationKey::reallocate(this->key_,newCapacity,length);
    bVar5 = puVar2 != (uint8_t *)0x0;
    iVar4 = 0;
    if (bVar5) {
      iVar4 = newCapacity;
    }
    (this->super_SortKeyByteSink).buffer_ = (char *)puVar2;
    (this->super_SortKeyByteSink).capacity_ = iVar4;
  }
  return bVar5;
}

Assistant:

UBool
CollationKeyByteSink::Resize(int32_t appendCapacity, int32_t length) {
    if (buffer_ == NULL) {
        return FALSE;  // allocation failed before already
    }
    int32_t newCapacity = 2 * capacity_;
    int32_t altCapacity = length + 2 * appendCapacity;
    if (newCapacity < altCapacity) {
        newCapacity = altCapacity;
    }
    if (newCapacity < 200) {
        newCapacity = 200;
    }
    uint8_t *newBuffer = key_.reallocate(newCapacity, length);
    if (newBuffer == NULL) {
        SetNotOk();
        return FALSE;
    }
    buffer_ = reinterpret_cast<char *>(newBuffer);
    capacity_ = newCapacity;
    return TRUE;
}